

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  code *pcVar1;
  GLuint GVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  col_type *pcVar6;
  undefined8 extraout_RDX;
  double dVar7;
  float local_354;
  double now;
  int local_340;
  Perf stat_7;
  Perf stat_6;
  int right;
  Perf stat_5;
  Perf stat_4;
  float local_2f8;
  float local_2f4;
  float local_2f0;
  float local_2ec;
  float local_2e8;
  float local_2e4;
  tmat4x4<float> local_2e0;
  Perf local_29e;
  Perf local_29d;
  undefined1 local_29c [6];
  Perf stat_3;
  Perf stat_2;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  tmat4x4<float> local_248;
  Perf local_205;
  int local_204;
  int iStack_200;
  Perf stat_1;
  int local_1fc;
  tvec3<float> local_1f8;
  tmat4x4<float> local_1ec;
  float local_1ac;
  iterator iStack_1a8;
  float rotation_1;
  __normal_iterator<Rotation_*,_std::vector<Rotation,_std::allocator<Rotation>_>_> local_1a0;
  __normal_iterator<Rotation_*,_std::vector<Rotation,_std::allocator<Rotation>_>_> local_198;
  const_iterator local_190;
  __normal_iterator<Rotation_*,_std::vector<Rotation,_std::allocator<Rotation>_>_> local_188;
  const_iterator local_180;
  tmat4x4<float> local_174;
  float local_134;
  reference pvStack_130;
  float rotation;
  Rotation *rot;
  int c;
  int lastValid;
  float now_1;
  Perf stat;
  mat4 mvp;
  mat4 p;
  mat4 m;
  int viewportSize;
  int height;
  int width;
  float ratio;
  double lastPerfPrintTime;
  GLuint vao;
  GLuint cubemap;
  GLuint textured_location;
  GLuint scale_location;
  GLuint vscale_location;
  GLuint vpos_location;
  GLuint mvp_location;
  GLuint program;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLFWwindow *window;
  
  window._4_4_ = 0;
  iVar3 = glfwInit();
  if (iVar3 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed to init GLFW");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"GLFW Successfully Started");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  glfwSetErrorCallback(glfw_error_callback);
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,0);
  _fragment_shader = glfwCreateWindow(0x280,0x1e0,"Stupid SH Tricks",0);
  if (_fragment_shader == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Failed to create window");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  glfwSetKeyCallback(_fragment_shader,glfw_key_callback);
  glfwMakeContextCurrent(_fragment_shader);
  glewInit();
  glfwSwapInterval(1);
  initPerformanceData();
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1a0);
  (*__glewGenVertexArrays)(1,&lastPerfPrintTime);
  (*__glewBindVertexArray)(lastPerfPrintTime._0_4_);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1a5);
  (*__glewGenBuffers)(1,&sphere_buffer);
  (*__glewBindBuffer)(0x8892,sphere_buffer);
  regenerateSpherePositions();
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1aa);
  (*__glewGenBuffers)(1,&vertex_buffer);
  (*__glewBindBuffer)(0x8892,vertex_buffer);
  regenerateBuffer();
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1af);
  (*__glewGenBuffers)(1,&legendre_buffer);
  (*__glewBindBuffer)(0x8892,legendre_buffer);
  regenerateSHBuffer();
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1b4);
  (*__glewGenBuffers)(1,&index_buffer);
  (*__glewBindBuffer)(0x8893,index_buffer);
  regenerateIndices();
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1b9);
  glGenTextures(1,(long)&lastPerfPrintTime + 4);
  (*__glewActiveTexture)(0x84c0);
  glBindTexture(0xde1,lastPerfPrintTime._4_4_);
  loadCubemap("assets/ToTheMoonRocket.jpg");
  program = (*__glewCreateShader)(0x8b31);
  (*__glewShaderSource)(program,1,&vertex_shader_text,0);
  (*__glewCompileShader)(program);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1c3);
  checkShaderError(program);
  mvp_location = (*__glewCreateShader)(0x8b30);
  (*__glewShaderSource)(mvp_location,1,&fragment_shader_text,0);
  (*__glewCompileShader)(mvp_location);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1c9);
  checkShaderError(mvp_location);
  vpos_location = (*__glewCreateProgram)();
  (*__glewAttachShader)(vpos_location,program);
  (*__glewAttachShader)(vpos_location,mvp_location);
  (*__glewLinkProgram)(vpos_location);
  (*__glewValidateProgram)(vpos_location);
  checkLinkError(vpos_location);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1d2);
  vscale_location = (*__glewGetUniformLocation)(vpos_location,"MVP");
  cubemap = (*__glewGetUniformLocation)(vpos_location,"scale");
  vao = (*__glewGetUniformLocation)(vpos_location,"textured");
  scale_location = (*__glewGetAttribLocation)(vpos_location,"vPos");
  textured_location = (*__glewGetAttribLocation)(vpos_location,"vScale");
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1da);
  glClearColor();
  glEnable(0xb71);
  (*__glewBindBuffer)(0x8892,sphere_buffer);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1e2);
  (*__glewEnableVertexAttribArray)(scale_location);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1e4);
  (*__glewVertexAttribPointer)(scale_location,3,0x1406,0,0xc,0);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1e6);
  (*__glewEnableVertexAttribArray)(textured_location);
  _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                  ,0x1ea);
  markPerformanceFrame();
  printPerformanceData();
  _width = (double)glfwGetTime();
  while (iVar3 = glfwWindowShouldClose(_fragment_shader), iVar3 == 0) {
    glm::detail::tmat4x4<float>::tmat4x4((tmat4x4<float> *)((long)&p.value[3].field_0 + 8));
    glm::detail::tmat4x4<float>::tmat4x4((tmat4x4<float> *)((long)&mvp.value[3].field_0 + 8));
    glm::detail::tmat4x4<float>::tmat4x4((tmat4x4<float> *)&now_1);
    Perf::Perf((Perf *)((long)&lastValid + 3),"Setup frame and clear buffers");
    glfwGetFramebufferSize
              (_fragment_shader,&viewportSize,(undefined1 *)((long)&m.value[3].field_0 + 0xc));
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x1f8);
    height = (int)((float)viewportSize / (float)(int)m.value[3].field_0.field_0.w);
    m.value[3].field_0.field_0.z = (value_type)((int)m.value[3].field_0.field_0.w / 5);
    glViewport(0,0,viewportSize,m.value[3].field_0.field_0.w);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x1fc);
    glClear(0x4100);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x1fe);
    dVar7 = (double)glfwGetTime();
    c = (int)(float)dVar7;
    rot._4_4_ = 0;
    sVar5 = std::vector<Rotation,_std::allocator<Rotation>_>::size(&rotations);
    rot._0_4_ = (int)sVar5;
    while (rot._0_4_ = (int)rot + -1, -1 < (int)rot) {
      pvStack_130 = std::vector<Rotation,_std::allocator<Rotation>_>::operator[]
                              (&rotations,(long)(int)rot);
      local_134 = (((float)c - pvStack_130->startTime) * 180.0) / 3.1415927;
      if (local_134 < 360.0) {
        glm::rotate<float>(&local_174,(tmat4x4<float> *)((long)&p.value[3].field_0 + 8),&local_134,
                           &pvStack_130->axis);
        glm::detail::tmat4x4<float>::operator=
                  ((tmat4x4<float> *)((long)&p.value[3].field_0 + 8),&local_174);
        rot._4_4_ = (int)rot;
      }
    }
    if (0 < rot._4_4_) {
      local_188._M_current =
           (Rotation *)std::vector<Rotation,_std::allocator<Rotation>_>::begin(&rotations);
      __gnu_cxx::__normal_iterator<Rotation_const*,std::vector<Rotation,std::allocator<Rotation>>>::
      __normal_iterator<Rotation*>
                ((__normal_iterator<Rotation_const*,std::vector<Rotation,std::allocator<Rotation>>>
                  *)&local_180,&local_188);
      local_1a0._M_current =
           (Rotation *)std::vector<Rotation,_std::allocator<Rotation>_>::begin(&rotations);
      local_198 = __gnu_cxx::
                  __normal_iterator<Rotation_*,_std::vector<Rotation,_std::allocator<Rotation>_>_>::
                  operator+(&local_1a0,(long)rot._4_4_);
      __gnu_cxx::__normal_iterator<Rotation_const*,std::vector<Rotation,std::allocator<Rotation>>>::
      __normal_iterator<Rotation*>
                ((__normal_iterator<Rotation_const*,std::vector<Rotation,std::allocator<Rotation>>>
                  *)&local_190,&local_198);
      iStack_1a8 = std::vector<Rotation,_std::allocator<Rotation>_>::erase
                             (&rotations,local_180,local_190);
    }
    if (0 < antiRotationFrames) {
      local_354 = (float)theta_n;
      local_1ac = ((float)antiRotationFrames * 360.0) / local_354;
      local_1fc = 0;
      iStack_200 = -1;
      local_204 = 0;
      glm::detail::tvec3<float>::tvec3<int,int,int>
                (&local_1f8,&local_1fc,&stack0xfffffffffffffe00,&local_204);
      glm::rotate<float>(&local_1ec,(tmat4x4<float> *)((long)&p.value[3].field_0 + 8),&local_1ac,
                         &local_1f8);
      glm::detail::tmat4x4<float>::operator=
                ((tmat4x4<float> *)((long)&p.value[3].field_0 + 8),&local_1ec);
    }
    Perf::Perf(&local_205,"Setup vertex pointers for first draw");
    local_24c = -(float)height;
    local_250 = -1.0;
    local_254 = 1.0;
    local_258 = 10.0;
    local_25c = -10.0;
    glm::ortho<float>(&local_248,&local_24c,(float *)&height,&local_250,&local_254,&local_258,
                      &local_25c);
    glm::detail::tmat4x4<float>::operator=
              ((tmat4x4<float> *)((long)&mvp.value[3].field_0 + 8),&local_248);
    glm::detail::operator*
              ((tmat4x4<float> *)local_29c,(tmat4x4<float> *)((long)&mvp.value[3].field_0 + 8),
               (tmat4x4<float> *)((long)&p.value[3].field_0 + 8));
    glm::detail::tmat4x4<float>::operator=((tmat4x4<float> *)&now_1,(tmat4x4<float> *)local_29c);
    (*__glewUseProgram)(vpos_location);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x21a);
    GVar2 = vscale_location;
    pcVar1 = __glewUniformMatrix4fv;
    pcVar6 = glm::detail::tmat4x4<float>::operator[]((tmat4x4<float> *)&now_1,0);
    (*pcVar1)(GVar2,1,0,pcVar6);
    (*__glewUniform1f)(cubemap);
    (*__glewUniform1i)(vao,textured & 1,extraout_RDX,
                       CONCAT71((int7)((ulong)pcVar6 >> 8),textured) & 0xffffffffffffff01);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x21e);
    (*__glewBindBuffer)(0x8892,vertex_buffer);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x222);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x224);
    Perf::Perf(&local_29d,"Draw base shape");
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    Perf::Perf(&local_29e,"Setup unforms and vertex arrays for components");
    local_2e4 = -0.5;
    local_2e8 = 0.5;
    local_2ec = -0.5;
    local_2f0 = 0.5;
    local_2f4 = 10.0;
    local_2f8 = -10.0;
    glm::ortho<float>(&local_2e0,&local_2e4,&local_2e8,&local_2ec,&local_2f0,&local_2f4,&local_2f8);
    glm::detail::tmat4x4<float>::operator=
              ((tmat4x4<float> *)((long)&mvp.value[3].field_0 + 8),&local_2e0);
    glm::detail::operator*
              ((tmat4x4<float> *)&right,(tmat4x4<float> *)((long)&mvp.value[3].field_0 + 8),
               (tmat4x4<float> *)((long)&p.value[3].field_0 + 8));
    glm::detail::tmat4x4<float>::operator=((tmat4x4<float> *)&now_1,(tmat4x4<float> *)&right);
    GVar2 = vscale_location;
    pcVar1 = __glewUniformMatrix4fv;
    pcVar6 = glm::detail::tmat4x4<float>::operator[]((tmat4x4<float> *)&now_1,0);
    (*pcVar1)(GVar2,1,0,pcVar6);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x232);
    (*__glewBindBuffer)(0x8892,legendre_buffer);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x235);
    glClear(0x100);
    Perf::Perf(&stat_6,"Draw left side");
    glViewport(0,(int)m.value[3].field_0.field_0.z << 2,m.value[3].field_0.field_0.z,
               m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,0);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x241);
    glViewport(0,(int)m.value[3].field_0.field_0.z << 1,m.value[3].field_0.field_0.z,
               m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count << 2);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x247);
    glViewport(0,m.value[3].field_0.field_0.z,m.value[3].field_0.field_0.z,
               m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count << 3);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x24d);
    glViewport(0,0,m.value[3].field_0.field_0.z,m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count * 0xc);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x253);
    Perf::Perf(&stat_7,"Draw right side");
    local_340 = viewportSize - m.value[3].field_0._8_4_;
    glViewport(local_340,(int)m.value[3].field_0.field_0.z << 2,m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count << 4);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x25f);
    glViewport(local_340,(int)m.value[3].field_0.field_0.z * 3,m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count * 0x14);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x265);
    glViewport(local_340,(int)m.value[3].field_0.field_0.z << 1,m.value[3].field_0.field_0.z,
               m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count * 0x18);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x26b);
    glViewport(local_340,m.value[3].field_0.field_0.z,m.value[3].field_0.field_0.z,
               m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count * 0x1c);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x271);
    glViewport(local_340,0,m.value[3].field_0.field_0.z,m.value[3].field_0.field_0.z);
    (*__glewUniform1f)(cubemap);
    (*__glewVertexAttribPointer)(textured_location,1,0x1406,0,4,vertex_count << 5);
    glDrawElements(4,index_count & 0xffffffff,0x1405,0);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x277);
    Perf::Perf((Perf *)((long)&now + 7),"Swap buffers");
    glfwSwapBuffers(_fragment_shader);
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x27d);
    Perf::Perf((Perf *)((long)&now + 6),"Poll events");
    glfwPollEvents();
    _check_gl_error("/workspace/llm4binary/github/license_all_cmakelists_25/SpexGuy[P]StupidSHTricks/main.cpp"
                    ,0x282);
    if (0 < rotationFrames) {
      rotateParams();
      rotationFrames = rotationFrames + -1;
    }
    if (0 < antiRotationFrames) {
      antiRotationFrames = antiRotationFrames + -1;
    }
    markPerformanceFrame();
    dVar7 = (double)glfwGetTime();
    if (10.0 < dVar7 - _width) {
      printPerformanceData();
      _width = dVar7;
    }
  }
  return 0;
}

Assistant:

int main() {
    if (!glfwInit()) {
        cout << "Failed to init GLFW" << endl;
        exit(-1);
    }
    cout << "GLFW Successfully Started" << endl;

    glfwSetErrorCallback(glfw_error_callback);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
#ifdef APPLE
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#endif
    GLFWwindow* window = glfwCreateWindow(640, 480, "Stupid SH Tricks", NULL, NULL);
    if (!window) {
        cout << "Failed to create window" << endl;
        exit(-1);
    }
    glfwSetKeyCallback(window, glfw_key_callback);

    glfwMakeContextCurrent(window);
    glewInit();

    glfwSwapInterval(1);

    GLuint vertex_shader, fragment_shader, program;
    GLuint mvp_location, vpos_location, vscale_location, scale_location, textured_location;
    GLuint cubemap;

    initPerformanceData();

    checkError();

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);
    checkError();

    glGenBuffers(1, &sphere_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    regenerateSpherePositions();
    checkError();

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    regenerateBuffer();
    checkError();

    glGenBuffers(1, &legendre_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
    regenerateSHBuffer();
    checkError();

    glGenBuffers(1, &index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, index_buffer);
    regenerateIndices();
    checkError();

    glGenTextures(1, &cubemap);
    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, cubemap);
    loadCubemap("assets/ToTheMoonRocket.jpg");

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);
    checkError();
    checkShaderError(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);
    checkError();
    checkShaderError(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);
    glValidateProgram(program);
    checkLinkError(program);
    checkError();


    mvp_location = glGetUniformLocation(program, "MVP");
    scale_location = glGetUniformLocation(program, "scale");
    textured_location = glGetUniformLocation(program, "textured");
    vpos_location = glGetAttribLocation(program, "vPos");
    vscale_location = glGetAttribLocation(program, "vScale");
    checkError();

    glClearColor(0.2f, 0.2f, 0.2f, 1.0f);

    glEnable(GL_DEPTH_TEST);

    // We'll always use the sphere_buffer for vPos
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    checkError();
    glEnableVertexAttribArray(vpos_location);
    checkError();
    glVertexAttribPointer(vpos_location, 3, GL_FLOAT, GL_FALSE, sizeof(vec3), 0);
    checkError();

    // We're going to use an attrib array for vScale, but it will be set up later.
    glEnableVertexAttribArray(vscale_location);
    checkError();

    // make sure performance data is clean going into main loop
    markPerformanceFrame();
    printPerformanceData();
    double lastPerfPrintTime = glfwGetTime();
    while (!glfwWindowShouldClose(window)) {
        float ratio;
        int width, height, viewportSize;
        mat4 m, p, mvp;

        {
            Perf stat("Setup frame and clear buffers");
            glfwGetFramebufferSize(window, &width, &height);
            checkError();
            ratio = width / (float) height;
            viewportSize = height / 5;
            glViewport(0, 0, width, height);
            checkError();
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            checkError();

            float now = float(glfwGetTime());
            int lastValid = 0;
            for (int c = rotations.size()-1; c >= 0; c--) {
                Rotation &rot = rotations[c];
                float rotation = float((now - rot.startTime) * 180 / M_PI);
                if (rotation < 360) {
                    m = rotate(m, rotation, rot.axis);
                    lastValid = c;
                }
            }
            if (lastValid > 0) {
                rotations.erase(rotations.begin(), rotations.begin() + lastValid);
            }

            if (antiRotationFrames > 0) {
                float rotation = antiRotationFrames * 360.f / theta_n;
                m = rotate(m, rotation, vec3(0,-1,0));
            }
        }

        {
            Perf stat("Setup vertex pointers for first draw");
            p = ortho(-ratio, ratio, -1.f, 1.f, 10.f, -10.f);
            mvp = p * m;

            glUseProgram(program);
            checkError();
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            glUniform1f(scale_location, 1.f);
            glUniform1i(textured_location, textured);
            checkError();

            // draw the base buffer
            glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
            checkError();
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), 0);
            checkError();
        }
        {
            Perf stat("Draw base shape");
            // glDrawArrays(GL_POINTS, 0, vertex_count);
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
        }

        // draw the components
        {
            Perf stat("Setup unforms and vertex arrays for components");
            p = ortho(-0.5f, 0.5f, -0.5f, 0.5f, 10.f, -10.f);
            mvp = p * m;
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            checkError();

            glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
            checkError();

            glClear(GL_DEPTH_BUFFER_BIT); // always draw components on top of base shape. Depth test still necessary since triangles are unordered
        }

        {
            Perf stat("Draw left side");
            // left side
            glViewport(0, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[0]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (0 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[1]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (1 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[2]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (2 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[3]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (3 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Draw right side");
            // right side
            int right = width - viewportSize;

            glViewport(right, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[4]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (4 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 3 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[5]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (5 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[6]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (6 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[7]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (7 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[8]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (8 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Swap buffers");
            glfwSwapBuffers(window);
            checkError();
        }
        {
            Perf stat("Poll events");
            glfwPollEvents();
            checkError();
        }

        if (rotationFrames > 0) {
            rotateParams();
            rotationFrames--;
        }
        if (antiRotationFrames > 0) {
            antiRotationFrames--;
        }

        markPerformanceFrame();

        double now = glfwGetTime();
        if (now - lastPerfPrintTime > 10.0) {
            printPerformanceData();
            lastPerfPrintTime = now;
        }
    }

    return 0;
}